

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O1

Bit16s envelope_calcsin0(Bit16u phase,Bit16u envelope)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  
  uVar1 = phase & 0xff;
  uVar2 = uVar1 ^ 0xff;
  if ((phase >> 8 & 1) == 0) {
    uVar2 = uVar1;
  }
  uVar1 = (uint)logsinrom[uVar2] + (int)CONCAT62(in_register_00000032,envelope) * 8;
  uVar2 = 0x1fff;
  if (uVar1 < 0x1fff) {
    uVar2 = uVar1;
  }
  return ((phase & 0x3ff) < 0x200) - 1 ^
         (ushort)(((uint)exprom[~uVar2 & 0xff] * 2 | 0x800) >> ((byte)(uVar2 >> 8) & 0x1f));
}

Assistant:

Bit16s envelope_calcsin0(Bit16u phase, Bit16u envelope) {
	phase &= 0x3ff;
	Bit16u out = 0;
	Bit16u neg = 0;
	if (phase & 0x200) {
		neg = ~0;
	}
	if (phase & 0x100) {
		out = logsinrom[(phase & 0xff) ^ 0xff];
	}
	else {
		out = logsinrom[phase & 0xff];
	}
	return envelope_calcexp(out + (envelope << 3)) ^ neg;
}